

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

bool arc::iso(atom *a,atom *b)

{
  bool bVar1;
  atom *a_00;
  atom *b_00;
  
  while( true ) {
    if (a->type != b->type) {
      return false;
    }
    if (a->type != T_CONS) break;
    a_00 = car(a);
    b_00 = car(b);
    bVar1 = iso(a_00,b_00);
    if (!bVar1) {
      return false;
    }
    a = cdr(a);
    b = cdr(b);
  }
  bVar1 = is(a,b);
  return bVar1;
}

Assistant:

bool iso(const atom& a, const atom& b) {
		if (a.type == b.type) {
			switch (a.type) {
			case T_CONS:
				return iso(car(a), car(b)) && iso(cdr(a), cdr(b));
			default:
				return is(a, b);
			}
		}
		return 0;
	}